

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageTestsUtil.cpp
# Opt level: O0

UVec3 __thiscall vkt::image::getShaderGridSize(image *this,ImageType imageType,UVec3 *imageSize)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  UVec3 UVar4;
  UVec3 *imageSize_local;
  ImageType imageType_local;
  
  switch(imageType) {
  case IMAGE_TYPE_1D:
  case IMAGE_TYPE_BUFFER:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,1,1);
    uVar1 = extraout_EDX;
    break;
  case IMAGE_TYPE_1D_ARRAY:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    uVar2 = tcu::Vector<unsigned_int,_3>::z(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,1);
    uVar1 = extraout_EDX_00;
    break;
  case IMAGE_TYPE_2D:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    uVar2 = tcu::Vector<unsigned_int,_3>::y(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,1);
    uVar1 = extraout_EDX_01;
    break;
  case IMAGE_TYPE_2D_ARRAY:
  case IMAGE_TYPE_3D:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    uVar2 = tcu::Vector<unsigned_int,_3>::y(imageSize);
    uVar3 = tcu::Vector<unsigned_int,_3>::z(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,uVar3);
    uVar1 = extraout_EDX_02;
    break;
  case IMAGE_TYPE_CUBE:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    uVar2 = tcu::Vector<unsigned_int,_3>::y(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,6);
    uVar1 = extraout_EDX_03;
    break;
  case IMAGE_TYPE_CUBE_ARRAY:
    uVar1 = tcu::Vector<unsigned_int,_3>::x(imageSize);
    uVar2 = tcu::Vector<unsigned_int,_3>::y(imageSize);
    uVar3 = tcu::Vector<unsigned_int,_3>::z(imageSize);
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,uVar1,uVar2,uVar3 * 6);
    uVar1 = extraout_EDX_04;
    break;
  default:
    tcu::Vector<unsigned_int,_3>::Vector((Vector<unsigned_int,_3> *)this,1,1,1);
    uVar1 = extraout_EDX_05;
  }
  UVar4.m_data[2] = uVar1;
  UVar4.m_data._0_8_ = this;
  return (UVec3)UVar4.m_data;
}

Assistant:

tcu::UVec3 getShaderGridSize (const ImageType imageType, const tcu::UVec3& imageSize)
{
	switch (imageType)
	{
		case IMAGE_TYPE_1D:
		case IMAGE_TYPE_BUFFER:
			return tcu::UVec3(imageSize.x(), 1u, 1u);

		case IMAGE_TYPE_1D_ARRAY:
			return tcu::UVec3(imageSize.x(), imageSize.z(), 1u);

		case IMAGE_TYPE_2D:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 1u);

		case IMAGE_TYPE_2D_ARRAY:
		case IMAGE_TYPE_3D:
			return tcu::UVec3(imageSize.x(), imageSize.y(), imageSize.z());

		case IMAGE_TYPE_CUBE:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 6u);

		case IMAGE_TYPE_CUBE_ARRAY:
			return tcu::UVec3(imageSize.x(), imageSize.y(), 6u * imageSize.z());

		default:
			DE_FATAL("Unknown image type");
			return tcu::UVec3(1u, 1u, 1u);
	}
}